

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O3

size_t arangodb::velocypack::anon_unknown_0::JSONStringCopySSE42
                 (uint8_t *dst,uint8_t *src,size_t limit)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  
  auVar2 = _DAT_00113c50;
  if (limit < 0x10) {
    sVar6 = 0;
  }
  else {
    lVar5 = 0;
    do {
      iVar3 = pcmpistri(auVar2,*(undefined1 (*) [16])src,0x14);
      if (iVar3 < 0x10) {
        memcpy(dst,src,(long)iVar3);
        return iVar3 - lVar5;
      }
      *(undefined1 (*) [16])dst = *(undefined1 (*) [16])src;
      src = (uint8_t *)((long)src + 0x10);
      dst = (uint8_t *)((long)dst + 0x10);
      lVar1 = limit + lVar5;
      lVar5 = lVar5 + -0x10;
    } while (0xf < lVar1 - 0x10U);
    limit = limit + lVar5;
    sVar6 = -lVar5;
  }
  if (limit != 0) {
    iVar4 = pcmpistri(_DAT_00113c50,*(undefined1 (*) [16])src,0x14);
    iVar3 = (int)limit;
    if (iVar4 < (int)limit) {
      iVar3 = iVar4;
    }
    memcpy(dst,src,(long)iVar3);
    sVar6 = sVar6 + (long)iVar3;
  }
  return sVar6;
}

Assistant:

std::size_t JSONStringCopySSE42(uint8_t* dst, uint8_t const* src,
                                std::size_t limit) {
  alignas(16) static char const ranges[17] =
      "\x20\x21\x23\x5b\x5d\xff          ";
  //= "\x01\x1f\"\"\\\\\"\"\"\"\"\"\"\"\"\"";

  __m128i const r = _mm_load_si128(reinterpret_cast<__m128i const*>(ranges));
  std::size_t count = 0;
  int x = 0;
  while (limit >= 16) {
    __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
    x = _mm_cmpistri(r, /* 6, */ s, /* 16, */
                     _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                         _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
    if (x < 16) {
      memcpy(dst, src, x);
      count += x;
      return count;
    }
    _mm_storeu_si128(reinterpret_cast<__m128i*>(dst), s);
    src += 16;
    dst += 16;
    limit -= 16;
    count += 16;
  }
  if (limit == 0) {
    return count;
  }
  __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(src));
  x = _mm_cmpistri(r, /* 6, */ s, /* limit, */
                   _SIDD_UBYTE_OPS | _SIDD_CMP_RANGES |
                       _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
  if (x > static_cast<int>(limit)) {
    x = static_cast<int>(limit);
  }
  memcpy(dst, src, x);
  count += x;
  return count;
}